

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Problem_CGBG_FF.cpp
# Opt level: O0

void __thiscall Problem_CGBG_FF::ScatterHouses(Problem_CGBG_FF *this)

{
  reference pvVar1;
  long in_RDI;
  double dVar2;
  Index hI;
  undefined4 local_c;
  
  for (local_c = 0; (ulong)local_c < *(ulong *)(in_RDI + 0x130); local_c = local_c + 1) {
    dVar2 = anon_unknown.dwarf_2c5742::SampleUniform();
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1f8),(ulong)local_c);
    *pvVar1 = dVar2;
    dVar2 = anon_unknown.dwarf_2c5742::SampleUniform();
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x210),(ulong)local_c);
    *pvVar1 = dVar2;
  }
  return;
}

Assistant:

void Problem_CGBG_FF::ScatterHouses()
{
    for(Index hI=0; hI < _m_nrHouses; hI++)
    {
        //we sample a position for this house
        _m_housePositionX[hI] = SampleUniform();
        _m_housePositionY[hI] = SampleUniform();
    }
}